

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O2

void __thiscall
leveldb::_Test_ConsumeDecimalNumberRoundtrip::_Run(_Test_ConsumeDecimalNumberRoundtrip *this)

{
  uint64_t num;
  uint64_t number;
  string local_1e0;
  Tester local_1c0;
  
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(0,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(9,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(10,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(0xb,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(0x13,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(99,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(100,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(0x6d,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(0xbe,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
  ConsumeDecimalNumberRoundtripTest(0x7b,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  test::Tester::Tester
            (&local_1c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x44);
  NumberToString_abi_cxx11_(&local_1e0,(leveldb *)0xbc614e,num);
  test::Tester::IsEq<char[9],std::__cxx11::string>(&local_1c0,(char (*) [9])"12345678",&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  test::Tester::~Tester(&local_1c0);
  for (number = 0xffffffffffffffff; number != 0xffffffffffffff9b; number = number - 1) {
    std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
    ConsumeDecimalNumberRoundtripTest(number,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  return;
}

Assistant:

TEST(Logging, ConsumeDecimalNumberRoundtrip) {
  ConsumeDecimalNumberRoundtripTest(0);
  ConsumeDecimalNumberRoundtripTest(1);
  ConsumeDecimalNumberRoundtripTest(9);

  ConsumeDecimalNumberRoundtripTest(10);
  ConsumeDecimalNumberRoundtripTest(11);
  ConsumeDecimalNumberRoundtripTest(19);
  ConsumeDecimalNumberRoundtripTest(99);

  ConsumeDecimalNumberRoundtripTest(100);
  ConsumeDecimalNumberRoundtripTest(109);
  ConsumeDecimalNumberRoundtripTest(190);
  ConsumeDecimalNumberRoundtripTest(123);
  ASSERT_EQ("12345678", NumberToString(12345678));

  for (uint64_t i = 0; i < 100; ++i) {
    uint64_t large_number = std::numeric_limits<uint64_t>::max() - i;
    ConsumeDecimalNumberRoundtripTest(large_number);
  }
}